

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

void __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
          (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this,
          pair<wasm::Expression_*,_wasm::Expression_*> item)

{
  mapped_type *pmVar1;
  UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this_local;
  pair<wasm::Expression_*,_wasm::Expression_*> item_local;
  
  item_local.first = item.second;
  this_local = (UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)item.first
  ;
  std::
  queue<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::deque<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>_>
  ::push(&this->data,(value_type *)&this_local);
  pmVar1 = std::
           unordered_map<std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>_>
           ::operator[](&this->count,(key_type *)&this_local);
  *pmVar1 = *pmVar1 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }